

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddr.cpp
# Opt level: O0

void axl::io::createSockAddrNetMask_ip6(sockaddr_in6 *addr,size_t bitCount)

{
  ulong in_RSI;
  undefined2 *in_RDI;
  size_t maxBitCount;
  
  memset(in_RDI,0,0x1c);
  *in_RDI = 10;
  if (0x80 < in_RSI) {
    in_RSI = 0x80;
  }
  sl::setBitRange((size_t *)maxBitCount,(size_t)in_RDI,in_RSI,0x80);
  return;
}

Assistant:

void
createSockAddrNetMask_ip6(
	sockaddr_in6* addr,
	size_t bitCount
) {
	memset(addr, 0, sizeof(sockaddr_in6));
	addr->sin6_family = AF_INET6;

	size_t maxBitCount = sizeof(addr->sin6_addr) * 8;
	if (bitCount > maxBitCount)
		bitCount = maxBitCount;

	sl::setBitRange(
		(size_t*)&addr->sin6_addr,
		sizeof(addr->sin6_addr) / sizeof(size_t),
		0,
		bitCount
	);
}